

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTryTableExpr
          (BinaryReaderInterp *this,Type sig_type,CatchClauseVector *catches)

{
  Offset OVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  size_t sVar6;
  Result RVar7;
  Offset fixup_offset;
  Offset OVar8;
  TypeVector *pTVar9;
  Enum EVar10;
  Index catch_drop_count_00;
  string_view *psVar11;
  pointer pCVar12;
  bool bVar13;
  u32 exn_stack_height;
  TypeChecker *local_1b8;
  SharedValidator *local_1b0;
  Index catch_drop_count;
  undefined4 uStack_1a4;
  char *pcStack_1a0;
  anon_union_16_2_ecfd7102_for_Location_1 local_198;
  Type local_188;
  BinaryReaderInterp *local_180;
  string_view *local_178;
  pointer local_170;
  Label *vlabel;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  anon_union_16_2_ecfd7102_for_Location_1 aaStack_158 [3];
  HandlerDesc local_120;
  Location loc;
  Var local_c8;
  Var local_80;
  CatchKind local_38;
  
  local_1b0 = &this->validator_;
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_188 = sig_type;
  RVar7 = SharedValidator::BeginTryTable(local_1b0,&loc,sig_type);
  if (RVar7.enum_ != Error) {
    local_1b8 = &(this->validator_).typechecker_;
    RVar7 = TypeChecker::GetCatchCount
                      (local_1b8,
                       (int)((ulong)((long)(this->label_stack_).
                                           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->label_stack_).
                                          super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1,
                       &exn_stack_height);
    if (RVar7.enum_ != Error) {
      local_120.values =
           (int)((ulong)((long)(this->validator_).typechecker_.type_stack_.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->validator_).typechecker_.type_stack_.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) + this->local_count_;
      psVar11 = &this->filename_;
      local_120.kind = Catch;
      local_120.try_start_offset = 0xffffffff;
      local_120.try_end_offset = 0xffffffff;
      local_120.catches.
      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_120.catches.
      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_120.catches.
      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_120.field_4.catch_all_offset = 0xffffffff;
      local_120.exceptions = exn_stack_height;
      local_120.catch_all_ref = false;
      Istream::Emit(this->istream_,Br);
      fixup_offset = Istream::EmitFixupU32(this->istream_);
      pCVar12 = (catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      local_170 = (catches->
                  super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>)._M_impl
                  .super__Vector_impl_data._M_finish;
      bVar13 = false;
      local_180 = this;
      local_178 = psVar11;
      do {
        if (pCVar12 == local_170) {
          loc.field_1.field_0.last_column = 0;
          loc.filename._M_len = psVar11->_M_len;
          loc.filename._M_str = psVar11->_M_str;
          loc.field_1.field_1.offset =
               (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
               ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
          RVar7 = SharedValidator::EndTryTable(local_1b0,&loc,local_188);
          if (RVar7.enum_ == Error) {
LAB_001aa09a:
            EVar10 = Error;
          }
          else {
            OVar8 = Istream::end(this->istream_);
            local_120.try_start_offset = OVar8;
            PushLabel(this,Try,0xffffffff,0xffffffff,
                      (u32)(((long)(this->func_->handlers).
                                   super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->func_->handlers).
                                  super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x38));
            std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
            emplace_back<wabt::interp::HandlerDesc>(&this->func_->handlers,&local_120);
            Istream::ResolveFixupU32(this->istream_,fixup_offset);
            EVar10 = Ok;
          }
          std::_Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
          ~_Vector_base(&local_120.catches.
                         super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                       );
          return (Result)EVar10;
        }
        aaStack_158[0].field_0.line = 0;
        aaStack_158[0].field_0.first_column = 0;
        aaStack_158[0].field_0.last_column = 0;
        vlabel = (Label *)0x0;
        uStack_160._0_1_ = false;
        uStack_160._1_3_ = 0;
        uStack_15c = 0;
        TableCatch::TableCatch((TableCatch *)&loc,(Location *)&vlabel);
        local_38 = pCVar12->kind;
        local_198.field_0.last_column = 0;
        _catch_drop_count = psVar11->_M_len;
        pcStack_1a0 = psVar11->_M_str;
        local_198.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
        Var::Var((Var *)&vlabel,pCVar12->tag,(Location *)&catch_drop_count);
        Var::operator=(&local_c8,(Var *)&vlabel);
        Var::~Var((Var *)&vlabel);
        local_198.field_0.last_column = 0;
        _catch_drop_count = psVar11->_M_len;
        pcStack_1a0 = psVar11->_M_str;
        local_198.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
        Var::Var((Var *)&vlabel,pCVar12->depth,(Location *)&catch_drop_count);
        Var::operator=(&local_80,(Var *)&vlabel);
        Var::~Var((Var *)&vlabel);
        aaStack_158[0].field_0.last_column = 0;
        vlabel = (Label *)psVar11->_M_len;
        uStack_160 = SUB84(psVar11->_M_str,0);
        uStack_15c = (undefined4)((ulong)psVar11->_M_str >> 0x20);
        OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
        aaStack_158[0].field_0.line = (undefined4)OVar1;
        aaStack_158[0].field_0.first_column = (undefined4)(OVar1 >> 0x20);
        RVar7 = SharedValidator::OnTryTableCatch(local_1b0,(Location *)&vlabel,(TableCatch *)&loc);
        if (RVar7.enum_ == Error) {
LAB_001aa057:
          TableCatch::~TableCatch((TableCatch *)&loc);
          goto LAB_001aa09a;
        }
        if (!bVar13) {
          bVar13 = (local_38 & ~CatchRef) == CatchAll;
          if (bVar13) {
            local_120.catch_all_ref = (bool)((byte)local_38 & 1);
            local_120.field_4.catch_all_offset = Istream::end(this->istream_);
          }
          else {
            vlabel = (Label *)CONCAT44(vlabel._4_4_,pCVar12->tag);
            OVar8 = Istream::end(this->istream_);
            vlabel = (Label *)CONCAT44(OVar8,vlabel._0_4_);
            uStack_160._0_1_ = (local_38 & ~CatchAll) == CatchRef;
            std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
            emplace_back<wabt::interp::CatchDesc>(&local_120.catches,(CatchDesc *)&vlabel);
          }
          RVar7 = TypeChecker::GetLabel(local_1b8,pCVar12->depth,&vlabel);
          if (RVar7.enum_ != Error) {
            pTVar9 = &vlabel->result_types;
            if (vlabel->label_type == Loop) {
              pTVar9 = &vlabel->param_types;
            }
            pTVar2 = (pTVar9->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pTVar3 = (pTVar9->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            pTVar4 = (this->validator_).typechecker_.type_stack_.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pTVar5 = (this->validator_).typechecker_.type_stack_.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            sVar6 = vlabel->type_stack_limit;
            RVar7 = TypeChecker::GetCatchCount(local_1b8,pCVar12->depth,&catch_drop_count);
            this = local_180;
            if (RVar7.enum_ != Error) {
              catch_drop_count_00 = catch_drop_count + 1;
              _catch_drop_count = CONCAT44(uStack_1a4,catch_drop_count_00);
              EmitBr(local_180,pCVar12->depth,
                     (int)((ulong)((long)pTVar5 - (long)pTVar4) >> 3) - (int)sVar6,
                     (Index)((ulong)((long)pTVar3 - (long)pTVar2) >> 3),catch_drop_count_00);
              TableCatch::~TableCatch((TableCatch *)&loc);
              psVar11 = local_178;
              goto LAB_001aa049;
            }
          }
          goto LAB_001aa057;
        }
        TableCatch::~TableCatch((TableCatch *)&loc);
        bVar13 = true;
LAB_001aa049:
        pCVar12 = pCVar12 + 1;
      } while( true );
    }
  }
  return (Result)Error;
}

Assistant:

Result BinaryReaderInterp::OnTryTableExpr(Type sig_type,
                                          const CatchClauseVector& catches) {
  // we can just emit the catch handlers beforehand, so long as we skip over
  // them when entering the try.
  CHECK_RESULT(validator_.BeginTryTable(GetLocation(), sig_type));

  u32 exn_stack_height;
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &exn_stack_height));
  // NOTE: *NOT* GetLocalCount. we don't count the parameters, as they're not
  // part of the frame.
  u32 value_stack_height = validator_.type_stack_size() + local_count_;

  HandlerDesc desc =
      HandlerDesc{HandlerKind::Catch,        Istream::kInvalidOffset,
                  Istream::kInvalidOffset,   {},
                  {Istream::kInvalidOffset}, value_stack_height,
                  exn_stack_height};

  istream_.Emit(Opcode::Br);
  auto offset = istream_.EmitFixupU32();

  bool has_catch_all = false;
  for (const auto& raw_catch : catches) {
    TableCatch catch_;
    catch_.kind = raw_catch.kind;
    catch_.tag = Var(raw_catch.tag, GetLocation());
    catch_.target = Var(raw_catch.depth, GetLocation());
    CHECK_RESULT(validator_.OnTryTableCatch(GetLocation(), catch_));
    // stop emitting handlers after catch_all - but we must still validate the
    // handlers we don't emit
    if (has_catch_all) {
      continue;
    }
    if (catch_.IsCatchAll()) {
      has_catch_all = true;
      desc.catch_all_ref = catch_.IsRef();
      desc.catch_all_offset = istream_.end();
    } else {
      desc.catches.push_back(
          CatchDesc{raw_catch.tag, istream_.end(), catch_.IsRef()});
    }
    // we can't use GetBrDropKeepCount because we're not in a real block.
    SharedValidator::Label* vlabel;
    CHECK_RESULT(validator_.GetLabel(raw_catch.depth, &vlabel));
    // we keep the exception's results.
    // (this has already been validated, above)
    Index keep_count = vlabel->br_types().size();
    // we drop everything between the current block and the br target.
    // (we have already taken the TryTable block parameters into account, in
    // BeginTryTable)
    Index drop_count = validator_.type_stack_size() - vlabel->type_stack_limit;
    Index catch_drop_count;
    // we use the regular catch count
    CHECK_RESULT(validator_.GetCatchCount(raw_catch.depth, &catch_drop_count));
    // but increment, as we are semantically in a catch
    catch_drop_count++;
    EmitBr(raw_catch.depth, drop_count, keep_count, catch_drop_count);
  }

  CHECK_RESULT(validator_.EndTryTable(GetLocation(), sig_type));

  desc.try_start_offset = istream_.end();

  // as usual, the label is pushed after the catch handlers
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset,
            func_->handlers.size());
  func_->handlers.push_back(std::move(desc));

  istream_.ResolveFixupU32(offset);

  return Result::Ok;
}